

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINGetNumBacktrackOps(void *kinmem,long *nbacktr)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINGetNumBacktrackOps","kinsol_mem = NULL illegal.");
  }
  else {
    *nbacktr = *(long *)((long)kinmem + 0xf0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumBacktrackOps(void *kinmem, long int *nbacktr)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINGetNumBacktrackOps", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  *nbacktr = nbktrk;

  return(KIN_SUCCESS);
}